

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScsServer.cpp
# Opt level: O0

void __thiscall Scs::Server::RunConnection(Server *this,ClientConnectionPtr *connection)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  int __args_1;
  bool bVar1;
  element_type *peVar2;
  element_type *peVar3;
  element_type *peVar4;
  element_type *peVar5;
  element_type *this_01;
  size_type sVar6;
  uchar *puVar7;
  size_t __new_size;
  byte local_119;
  shared_ptr<Scs::Socket> local_f8;
  lock_guard<std::mutex> local_e8;
  lock_guard<std::mutex> lock_1;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_d8;
  duration local_d0;
  undefined1 local_c8 [24];
  lock_guard<std::mutex> lock;
  BufferPtr receivedData;
  size_t bytesReceived;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_90;
  duration local_88;
  duration<long,_std::ratio<1L,_1000L>_> local_80;
  shared_ptr<Scs::Socket> local_78;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_68;
  int local_5c;
  duration<long,_std::ratio<1L,_1000000L>_> local_58 [3];
  undefined1 local_40 [8];
  BufferPtr receiveBuffer;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_28;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_20;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  timeoutTime;
  ClientConnectionPtr *connection_local;
  Server *this_local;
  
  timeoutTime.__d.__r = (duration)(duration)connection;
  local_28._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)std::chrono::_V2::system_clock::now();
  this_00 = &receiveBuffer.
             super___shared_ptr<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount;
  std::chrono::duration<long,std::ratio<1l,1000l>>::duration<long_long,void>
            ((duration<long,std::ratio<1l,1000l>> *)this_00,&this->m_timeoutMs);
  local_20 = std::chrono::operator+
                       ((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                         *)&local_28,(duration<long,_std::ratio<1L,_1000L>_> *)this_00);
  CreateBuffer();
  peVar2 = std::
           __shared_ptr_access<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_40);
  std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>::reserve(peVar2,0x20000);
  while( true ) {
    peVar3 = std::
             __shared_ptr_access<Scs::Server::ClientConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<Scs::Server::ClientConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)connection);
    local_119 = 0;
    if ((peVar3->connected & 1U) != 0) {
      bVar1 = std::atomic::operator_cast_to_bool((atomic *)&this->m_shutDown);
      local_119 = bVar1 ^ 0xff;
    }
    if ((local_119 & 1) == 0) goto LAB_001e8f97;
    local_5c = 1;
    std::chrono::duration<long,std::ratio<1l,1000000l>>::duration<int,void>
              ((duration<long,std::ratio<1l,1000000l>> *)local_58,&local_5c);
    std::this_thread::sleep_for<long,std::ratio<1l,1000000l>>(local_58);
    local_68.__d.__r = (duration)std::chrono::_V2::system_clock::now();
    bVar1 = std::chrono::operator>=(&local_68,&local_20);
    if (bVar1) break;
    peVar3 = std::
             __shared_ptr_access<Scs::Server::ClientConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<Scs::Server::ClientConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)connection);
    peVar4 = std::__shared_ptr_access<Scs::Socket,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<Scs::Socket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&peVar3->socket);
    bVar1 = Socket::IsWritable(peVar4);
    if (bVar1) {
      peVar3 = std::
               __shared_ptr_access<Scs::Server::ClientConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<Scs::Server::ClientConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)connection);
      bVar1 = SendQueue::Empty(&peVar3->sendQueue);
      if (!bVar1) {
        peVar3 = std::
                 __shared_ptr_access<Scs::Server::ClientConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<Scs::Server::ClientConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)connection);
        peVar5 = std::
                 __shared_ptr_access<Scs::Server::ClientConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<Scs::Server::ClientConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)connection);
        std::shared_ptr<Scs::Socket>::shared_ptr(&local_78,&peVar5->socket);
        bVar1 = SendQueue::Send(&peVar3->sendQueue,&local_78);
        std::shared_ptr<Scs::Socket>::~shared_ptr(&local_78);
        if (((bVar1 ^ 0xffU) & 1) != 0) {
          LogWriteLine("Error sending data to client.  Shutting down connection.");
          peVar3 = std::
                   __shared_ptr_access<Scs::Server::ClientConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<Scs::Server::ClientConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)connection);
          peVar3->connected = false;
LAB_001e8f97:
          bVar1 = std::function::operator_cast_to_bool((function *)&this->m_onDisconnect);
          if (bVar1) {
            std::lock_guard<std::mutex>::lock_guard(&local_e8,&this->m_notifierMutex);
            peVar3 = std::
                     __shared_ptr_access<Scs::Server::ClientConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<Scs::Server::ClientConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)connection);
            std::function<void_(Scs::IServer_&,_int)>::operator()
                      (&this->m_onDisconnect,&this->super_IServer,peVar3->clientID);
            std::lock_guard<std::mutex>::~lock_guard(&local_e8);
          }
          std::shared_ptr<Scs::Socket>::shared_ptr(&local_f8,(nullptr_t)0x0);
          peVar3 = std::
                   __shared_ptr_access<Scs::Server::ClientConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<Scs::Server::ClientConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)connection);
          std::shared_ptr<Scs::Socket>::operator=(&peVar3->socket,&local_f8);
          std::shared_ptr<Scs::Socket>::~shared_ptr(&local_f8);
          peVar3 = std::
                   __shared_ptr_access<Scs::Server::ClientConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<Scs::Server::ClientConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)connection);
          LogWriteLine("Closing client %d connection thread.",(ulong)(uint)peVar3->clientID);
          std::shared_ptr<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>_>::~shared_ptr
                    ((shared_ptr<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>_> *)
                     local_40);
          return;
        }
        std::chrono::duration<long,std::ratio<1l,1000l>>::duration<unsigned_int,void>
                  ((duration<long,std::ratio<1l,1000l>> *)&local_80,&SEND_THROTTLE_MS);
        std::this_thread::sleep_for<long,std::ratio<1l,1000l>>(&local_80);
        local_90.__d.__r = (duration)std::chrono::_V2::system_clock::now();
        std::chrono::duration<long,std::ratio<1l,1000l>>::duration<long_long,void>
                  ((duration<long,std::ratio<1l,1000l>> *)&bytesReceived,&this->m_timeoutMs);
        local_88.__r = (rep)std::chrono::operator+
                                      (&local_90,
                                       (duration<long,_std::ratio<1L,_1000L>_> *)&bytesReceived);
        local_20 = (time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                    )local_88.__r;
      }
    }
    peVar3 = std::
             __shared_ptr_access<Scs::Server::ClientConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<Scs::Server::ClientConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)connection);
    peVar4 = std::__shared_ptr_access<Scs::Socket,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<Scs::Socket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&peVar3->socket);
    bVar1 = Socket::IsReadable(peVar4);
    if (bVar1) {
      peVar2 = std::
               __shared_ptr_access<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_40);
      this_01 = std::
                __shared_ptr_access<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)local_40);
      sVar6 = std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>::capacity(this_01);
      std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>::resize(peVar2,sVar6);
      peVar3 = std::
               __shared_ptr_access<Scs::Server::ClientConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<Scs::Server::ClientConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)connection);
      peVar4 = std::__shared_ptr_access<Scs::Socket,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<Scs::Socket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&peVar3->socket);
      peVar2 = std::
               __shared_ptr_access<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_40);
      puVar7 = std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>::data(peVar2);
      peVar2 = std::
               __shared_ptr_access<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_40);
      sVar6 = std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>::size(peVar2);
      __new_size = Socket::Receive(peVar4,puVar7,sVar6,0);
      if (__new_size != 0) {
        peVar2 = std::
                 __shared_ptr_access<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_40);
        std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>::resize(peVar2,__new_size);
        peVar3 = std::
                 __shared_ptr_access<Scs::Server::ClientConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<Scs::Server::ClientConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)connection);
        peVar2 = std::
                 __shared_ptr_access<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_40);
        puVar7 = std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>::data(peVar2);
        peVar2 = std::
                 __shared_ptr_access<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_40);
        sVar6 = std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>::size(peVar2);
        ReceiveQueue::Push(&peVar3->receiveQueue,puVar7,sVar6);
        peVar2 = std::
                 __shared_ptr_access<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_40);
        std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>::clear(peVar2);
        std::
        __shared_ptr_access<Scs::Server::ClientConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
        ::operator->((__shared_ptr_access<Scs::Server::ClientConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)connection);
        ReceiveQueue::Pop((ReceiveQueue *)&lock);
        while (bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&lock), bVar1) {
          bVar1 = std::function::operator_cast_to_bool((function *)&this->m_onReceiveData);
          if (bVar1) {
            std::lock_guard<std::mutex>::lock_guard
                      ((lock_guard<std::mutex> *)(local_c8 + 0x10),&this->m_notifierMutex);
            peVar3 = std::
                     __shared_ptr_access<Scs::Server::ClientConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<Scs::Server::ClientConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)connection);
            __args_1 = peVar3->clientID;
            peVar2 = std::
                     __shared_ptr_access<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)&lock);
            puVar7 = std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>::data(peVar2);
            peVar2 = std::
                     __shared_ptr_access<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)&lock);
            sVar6 = std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>::size(peVar2);
            std::function<void_(Scs::IServer_&,_int,_const_void_*,_unsigned_long)>::operator()
                      (&this->m_onReceiveData,&this->super_IServer,__args_1,puVar7,sVar6);
            std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)(local_c8 + 0x10));
          }
          std::
          __shared_ptr_access<Scs::Server::ClientConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
          ::operator->((__shared_ptr_access<Scs::Server::ClientConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)connection);
          ReceiveQueue::Pop((ReceiveQueue *)local_c8);
          std::shared_ptr<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>_>::operator=
                    ((shared_ptr<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>_> *)
                     &lock,(shared_ptr<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>_>
                            *)local_c8);
          std::shared_ptr<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>_>::~shared_ptr
                    ((shared_ptr<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>_> *)
                     local_c8);
        }
        local_d8.__d.__r = (duration)std::chrono::_V2::system_clock::now();
        std::chrono::duration<long,std::ratio<1l,1000l>>::duration<long_long,void>
                  ((duration<long,std::ratio<1l,1000l>> *)&lock_1,&this->m_timeoutMs);
        local_d0.__r = (rep)std::chrono::operator+
                                      (&local_d8,(duration<long,_std::ratio<1L,_1000L>_> *)&lock_1);
        local_20 = (time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                    )local_d0.__r;
        std::shared_ptr<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>_>::~shared_ptr
                  ((shared_ptr<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>_> *)&lock)
        ;
      }
    }
  }
  peVar3 = std::
           __shared_ptr_access<Scs::Server::ClientConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<Scs::Server::ClientConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)connection);
  LogWriteLine("Client %d timed out. Closing connection.",(ulong)(uint)peVar3->clientID);
  peVar3 = std::
           __shared_ptr_access<Scs::Server::ClientConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<Scs::Server::ClientConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)connection);
  peVar3->connected = false;
  goto LAB_001e8f97;
}

Assistant:

void Server::RunConnection(ClientConnectionPtr connection)
{
	// Set timeout point
	auto timeoutTime = std::chrono::system_clock::now() + std::chrono::milliseconds(m_timeoutMs);

	// Create a receive buffer
	BufferPtr receiveBuffer = CreateBuffer();
	receiveBuffer->reserve(RECEIVE_BUFFER_SIZE);

	// Each client connection runs in a separate thread, controlled
	// by this function.
	while (connection->connected && !m_shutDown)
	{
		// Don't burn too much CPU while idling
		std::this_thread::sleep_for(std::chrono::microseconds(1));

		// Check for connection timeout.  We don't want to keep this connection thread
		// alive if we're not actively sending or receiving data to the client.
		if (std::chrono::system_clock::now() >= timeoutTime)
		{
			LogWriteLine("Client %d timed out. Closing connection.", connection->clientID);
			connection->connected = false;
			break;
		}

		// Check first to see if we can write to the socket
		if (connection->socket->IsWritable())
		{
			if (!connection->sendQueue.Empty())
			{
				if (!connection->sendQueue.Send(connection->socket))
				{
					LogWriteLine("Error sending data to client.  Shutting down connection.");
					connection->connected = false;
					break;
				}

				// We need to throttle our connection transmission rate
				std::this_thread::sleep_for(std::chrono::milliseconds(SEND_THROTTLE_MS));

				// Reset timeout
				timeoutTime = std::chrono::system_clock::now() + std::chrono::milliseconds(m_timeoutMs);
			}
		}

		// Check for incoming data
		if (connection->socket->IsReadable())
		{
			// Read data from socket
			receiveBuffer->resize(receiveBuffer->capacity());
			size_t bytesReceived = connection->socket->Receive(receiveBuffer->data(), receiveBuffer->size(), 0);
			if (bytesReceived)
			{
				// Push data into the receive queue
				receiveBuffer->resize(bytesReceived);
				connection->receiveQueue.Push(receiveBuffer->data(), receiveBuffer->size());
				receiveBuffer->clear();

				// Process data in receive queue
				BufferPtr receivedData = connection->receiveQueue.Pop();
				while (receivedData)
				{
					if (m_onReceiveData)
					{
						std::lock_guard<std::mutex> lock(m_notifierMutex);
						m_onReceiveData(*this, connection->clientID, receivedData->data(), receivedData->size());
					}
					receivedData = connection->receiveQueue.Pop();
				}		

				// Reset timeout
				timeoutTime = std::chrono::system_clock::now() + std::chrono::milliseconds(m_timeoutMs);
			}
		}
	}

	// We're shutting down, so make sure all sockets are disconnected
	// and the connection data structure is removed from the connection
	// list and deleted.
	if (m_onDisconnect)
	{
		std::lock_guard<std::mutex> lock(m_notifierMutex);
		m_onDisconnect(*this, connection->clientID);
	}
	connection->socket = nullptr;
	LogWriteLine("Closing client %d connection thread.", connection->clientID);
}